

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.cc
# Opt level: O0

void proto2_unittest::TestMixedFieldsAndExtensions::MergeImpl
               (MessageLite *to_msg,MessageLite *from_msg)

{
  uint uVar1;
  TestMixedFieldsAndExtensions **v1;
  TestMixedFieldsAndExtensions **v2;
  char *failure_msg;
  LogMessage *pLVar2;
  RepeatedField<unsigned_int> *this;
  RepeatedField<unsigned_int> *other;
  uint32_t *puVar3;
  anon_union_56_1_493b367e_for_TestMixedFieldsAndExtensions_7 *this_00;
  TestMixedFieldsAndExtensions *extendee;
  uint32_t cached_has_bits;
  LogMessage local_50;
  Voidify local_39;
  TestMixedFieldsAndExtensions *local_38;
  Nullable<const_char_*> local_30;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  TestMixedFieldsAndExtensions *from;
  TestMixedFieldsAndExtensions *_this;
  MessageLite *from_msg_local;
  MessageLite *to_msg_local;
  
  local_38 = (TestMixedFieldsAndExtensions *)from_msg;
  absl_log_internal_check_op_result = (Nullable<const_char_*>)from_msg;
  from = (TestMixedFieldsAndExtensions *)to_msg;
  _this = (TestMixedFieldsAndExtensions *)from_msg;
  from_msg_local = to_msg;
  v1 = absl::lts_20250127::log_internal::
       GetReferenceableValue<proto2_unittest::TestMixedFieldsAndExtensions_const*>(&local_38);
  v2 = absl::lts_20250127::log_internal::
       GetReferenceableValue<proto2_unittest::TestMixedFieldsAndExtensions*>(&from);
  local_30 = absl::lts_20250127::log_internal::
             Check_NEImpl<proto2_unittest::TestMixedFieldsAndExtensions_const*,proto2_unittest::TestMixedFieldsAndExtensions*>
                       (v1,v2,"&from != _this");
  if (local_30 != (Nullable<const_char_*>)0x0) {
    failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_30);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_50,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/unittest.pb.cc"
               ,0x3452,failure_msg);
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_50);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_39,pLVar2);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_50);
  }
  this = _internal_mutable_b(from);
  other = _internal_b((TestMixedFieldsAndExtensions *)absl_log_internal_check_op_result);
  google::protobuf::RepeatedField<unsigned_int>::MergeFrom(this,other);
  puVar3 = google::protobuf::internal::HasBits<1>::operator[]
                     ((HasBits<1> *)(absl_log_internal_check_op_result + 0x28),0);
  uVar1 = *puVar3;
  if ((uVar1 & 1) != 0) {
    (from->field_0)._impl_.a_ = *(int32_t *)(absl_log_internal_check_op_result + 0x40);
  }
  puVar3 = google::protobuf::internal::HasBits<1>::operator[](&(from->field_0)._impl_._has_bits_,0);
  *puVar3 = uVar1 | *puVar3;
  this_00 = &from->field_0;
  extendee = default_instance();
  google::protobuf::internal::ExtensionSet::MergeFrom
            (&(this_00->_impl_)._extensions_,(MessageLite *)extendee,
             (ExtensionSet *)(absl_log_internal_check_op_result + 0x10));
  google::protobuf::internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
            (&(from->super_Message).super_MessageLite._internal_metadata_,
             (InternalMetadata *)(absl_log_internal_check_op_result + 8));
  return;
}

Assistant:

void TestMixedFieldsAndExtensions::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<TestMixedFieldsAndExtensions*>(&to_msg);
  auto& from = static_cast<const TestMixedFieldsAndExtensions&>(from_msg);
  // @@protoc_insertion_point(class_specific_merge_from_start:proto2_unittest.TestMixedFieldsAndExtensions)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  _this->_internal_mutable_b()->MergeFrom(from._internal_b());
  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000001u) != 0) {
    _this->_impl_.a_ = from._impl_.a_;
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_impl_._extensions_.MergeFrom(&default_instance(), from._impl_._extensions_);
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}